

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgUtils.hpp
# Opt level: O0

unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> __thiscall
TasGrid::Utils::make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext_const*&>
          (Utils *this,AccelerationContext **args)

{
  GridSequence *this_00;
  AccelerationContext **args_local;
  
  this_00 = (GridSequence *)operator_new(0x120);
  GridSequence::GridSequence(this_00,*args);
  ::std::unique_ptr<TasGrid::GridSequence,std::default_delete<TasGrid::GridSequence>>::
  unique_ptr<std::default_delete<TasGrid::GridSequence>,void>
            ((unique_ptr<TasGrid::GridSequence,std::default_delete<TasGrid::GridSequence>> *)this,
             this_00);
  return (__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args){
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}